

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid>
                 (DB *db,LIST *params,IfcSweptDiskSolid *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_2a8;
  TypeError *t_4;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_4;
  TypeError *t_3;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_3;
  TypeError *t_2;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_2;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcSweptDiskSolid *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcSweptDiskSolid *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcSolidModel>(db,params,&in->super_IfcSolidModel)
  ;
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 5) {
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 5 arguments to IfcSweptDiskSolid",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
  GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>>
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)(base + 0x40),
             (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,(DB *)params_local);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
  GenericConvert<double>
            ((double *)(base + 0x48),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,
             (DB *)params_local);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_2,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t_2);
  if (peVar2 == (element_type *)0x0) {
    local_2a8 = 0;
  }
  else {
    local_2a8 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_2a8 == 0) {
    GenericConvert<Assimp::STEP::Maybe<double>>
              ((Maybe<double> *)(base + 0x50),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2,(DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_3,(size_t)in_local);
  GenericConvert<double>
            ((double *)(base + 0x60),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_3,
             (DB *)params_local);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_3);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_4,(size_t)in_local);
  GenericConvert<double>
            ((double *)(base + 0x68),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_4,
             (DB *)params_local);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_4);
  return local_28;
}

Assistant:

size_t GenericFill<IfcSweptDiskSolid>(const DB& db, const LIST& params, IfcSweptDiskSolid* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcSolidModel*>(in));
	if (params.GetSize() < 5) { throw STEP::TypeError("expected 5 arguments to IfcSweptDiskSolid"); }    do { // convert the 'Directrix' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Directrix, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcSweptDiskSolid to be a `IfcCurve`")); }
    } while(0);
    do { // convert the 'Radius' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Radius, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcSweptDiskSolid to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'InnerRadius' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->InnerRadius, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcSweptDiskSolid to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'StartParam' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->StartParam, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 3 to IfcSweptDiskSolid to be a `IfcParameterValue`")); }
    } while(0);
    do { // convert the 'EndParam' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->EndParam, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcSweptDiskSolid to be a `IfcParameterValue`")); }
    } while(0);
	return base;
}